

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_encryptor.cpp
# Opt level: O2

void __thiscall cppcms::sessions::impl::aes_cipher::load(aes_cipher *this)

{
  cbc *pcVar1;
  message_digest *pmVar2;
  _Alloc_hider _Var3;
  invalid_argument *piVar4;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((this->cbc_)._M_t.
      super___uniq_ptr_impl<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>._M_t.
      super__Tuple_impl<0UL,_cppcms::crypto::cbc_*,_std::default_delete<cppcms::crypto::cbc>_>.
      super__Head_base<0UL,_cppcms::crypto::cbc_*,_false>._M_head_impl == (cbc *)0x0) {
    crypto::cbc::create((cbc *)&local_60,&this->cbc_name_);
    _Var3._M_p = local_60._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)0x0;
    pcVar1 = (this->cbc_)._M_t.
             super___uniq_ptr_impl<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>.
             _M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::cbc_*,_std::default_delete<cppcms::crypto::cbc>_>
             .super__Head_base<0UL,_cppcms::crypto::cbc_*,_false>._M_head_impl;
    (this->cbc_)._M_t.
    super___uniq_ptr_impl<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>._M_t.
    super__Tuple_impl<0UL,_cppcms::crypto::cbc_*,_std::default_delete<cppcms::crypto::cbc>_>.
    super__Head_base<0UL,_cppcms::crypto::cbc_*,_false>._M_head_impl = (cbc *)_Var3._M_p;
    if (pcVar1 != (cbc *)0x0) {
      (*pcVar1->_vptr_cbc[8])(pcVar1);
      if ((cbc *)local_60._M_dataplus._M_p != (cbc *)0x0) {
        (*(*(_func_int ***)local_60._M_dataplus._M_p)[8])();
      }
      _Var3._M_p = (pointer)(this->cbc_)._M_t.
                            super___uniq_ptr_impl<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cppcms::crypto::cbc_*,_std::default_delete<cppcms::crypto::cbc>_>
                            .super__Head_base<0UL,_cppcms::crypto::cbc_*,_false>._M_head_impl;
    }
    if ((cbc *)_Var3._M_p == (cbc *)0x0) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x30);
      std::operator+(&local_40,"cppcms::sessions::aes_cipher: the algorithm ",&this->cbc_name_);
      std::operator+(&local_60,&local_40,
                     " is not supported, or the cppcms library was compiled without OpenSSL/GNU-TLS support"
                    );
      booster::invalid_argument::invalid_argument(piVar4,&local_60);
      __cxa_throw(piVar4,&booster::invalid_argument::typeinfo,
                  booster::invalid_argument::~invalid_argument);
    }
    (*((cbc *)_Var3._M_p)->_vptr_cbc[4])();
    pcVar1 = (this->cbc_)._M_t.
             super___uniq_ptr_impl<cppcms::crypto::cbc,_std::default_delete<cppcms::crypto::cbc>_>.
             _M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::cbc_*,_std::default_delete<cppcms::crypto::cbc>_>
             .super__Head_base<0UL,_cppcms::crypto::cbc_*,_false>._M_head_impl;
    (*pcVar1->_vptr_cbc[2])(pcVar1,&this->cbc_key_);
  }
  if ((this->digest_)._M_t.
      super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
      ._M_t.
      super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
      .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl ==
      (message_digest *)0x0) {
    crypto::message_digest::create_by_name(&local_60);
    _Var3._M_p = local_60._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)0x0;
    pmVar2 = (this->digest_)._M_t.
             super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
             .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl;
    (this->digest_)._M_t.
    super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
    ._M_t.
    super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
    .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>._M_head_impl =
         (message_digest *)_Var3._M_p;
    if (pmVar2 != (message_digest *)0x0) {
      (*pmVar2->_vptr_message_digest[1])();
      if ((long *)local_60._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_60._M_dataplus._M_p + 8))();
      }
      _Var3._M_p = (pointer)(this->digest_)._M_t.
                            super___uniq_ptr_impl<cppcms::crypto::message_digest,_std::default_delete<cppcms::crypto::message_digest>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cppcms::crypto::message_digest_*,_std::default_delete<cppcms::crypto::message_digest>_>
                            .super__Head_base<0UL,_cppcms::crypto::message_digest_*,_false>.
                            _M_head_impl;
    }
    if ((cbc *)_Var3._M_p == (cbc *)0x0) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x30);
      std::operator+(&local_40,"cppcms::sessions::aes_cipher: the hash algorithm ",&this->cbc_name_)
      ;
      std::operator+(&local_60,&local_40,
                     " is not supported, or the cppcms library was compiled without OpenSSL/GNU-TLS support"
                    );
      booster::invalid_argument::invalid_argument(piVar4,&local_60);
      __cxa_throw(piVar4,&booster::invalid_argument::typeinfo,
                  booster::invalid_argument::~invalid_argument);
    }
  }
  return;
}

Assistant:

void aes_cipher::load()
{
	if(!cbc_.get()) {
		cbc_ = crypto::cbc::create(cbc_name_);
		if(!cbc_.get()) {
			throw booster::invalid_argument("cppcms::sessions::aes_cipher: the algorithm " + cbc_name_ + " is not supported,"
							" or the cppcms library was compiled without OpenSSL/GNU-TLS support");
		}
		cbc_->set_nonce_iv();
		cbc_->set_key(cbc_key_);
	}
	if(!digest_.get()) {
		digest_ = crypto::message_digest::create_by_name(md_name_);
		if(!digest_.get()) {
			throw booster::invalid_argument("cppcms::sessions::aes_cipher: the hash algorithm " + cbc_name_ + " is not supported,"
							" or the cppcms library was compiled without OpenSSL/GNU-TLS support");
		}
	}
}